

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  unsigned_short *puVar1;
  short sVar2;
  CallInfo *pCVar3;
  long lVar4;
  StkId pSVar5;
  uint uVar6;
  lu_byte lVar7;
  StkId level;
  ulong uVar8;
  lu_byte *plVar9;
  uint uVar10;
  TValue *io1;
  ulong uVar11;
  
  sVar2 = ci->nresults;
  if (-2 < sVar2 && L->hookmask != 0) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar10 = nres;
  if (sVar2 != -1) {
    if (sVar2 == 1) {
      if (nres == 0) {
        lVar7 = '\0';
      }
      else {
        pSVar5 = (L->top).p;
        (level->val).value_ = pSVar5[-(long)nres].val.value_;
        lVar7 = *(lu_byte *)((long)pSVar5 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar7;
      level = level + 1;
      goto LAB_001079f1;
    }
    if (sVar2 == 0) goto LAB_001079f1;
    uVar10 = (int)sVar2;
    if (sVar2 < -1) {
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 | 0x200;
      (pCVar3->u2).funcidx = nres;
      level = luaF_close(L,level,-1,1);
      pCVar3 = L->ci;
      puVar1 = &pCVar3->callstatus;
      *puVar1 = *puVar1 & 0xfdff;
      if (L->hookmask != 0) {
        lVar4 = (L->stack).offset;
        rethook(L,pCVar3,nres);
        level = (StkId)(((long)level - lVar4) + (long)(L->stack).p);
      }
      uVar10 = -(int)sVar2 - 3;
      if (sVar2 == -2) {
        uVar10 = nres;
      }
    }
  }
  pSVar5 = (L->top).p;
  uVar6 = nres;
  if ((int)uVar10 < nres) {
    uVar6 = uVar10;
  }
  uVar8 = 0;
  uVar11 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar11 = uVar8;
  }
  for (; uVar11 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
    *(undefined8 *)((long)level + uVar8) =
         *(undefined8 *)((long)pSVar5 + uVar8 + (long)nres * -0x10);
    *(undefined1 *)((long)level + uVar8 + 8) =
         *(undefined1 *)((long)pSVar5 + uVar8 + (long)nres * -0x10 + 8);
  }
  plVar9 = &(&level->val)[uVar11].tt_;
  for (; (long)uVar11 < (long)(int)uVar10; uVar11 = uVar11 + 1) {
    *plVar9 = '\0';
    plVar9 = plVar9 + 0x10;
  }
  level = level + (int)uVar10;
LAB_001079f1:
  (L->top).p = level;
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  int wanted = ci->nresults;
  if (l_unlikely(L->hookmask && !hastocloseCfunc(wanted)))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, wanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_TRAN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}